

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

void cpp_wrapper_update(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int value,
                       ion_err_t expected_status,ion_result_count_t expected_count,
                       ion_boolean_t check_result)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  undefined7 in_register_00000081;
  int local_38;
  int local_34;
  
  local_38 = value;
  local_34 = key;
  iVar2 = dictionary_update(&dict->dict,&local_34,&local_38);
  dict->last_status = iVar2;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,(int32_t)CONCAT71(in_register_00000081,expected_status),(int)iVar2.error,
                     0x57,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                    );
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_int_are_equal
                      (tc,expected_count,iVar2.count,0x58,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
    if (pVar1 != '\0') {
      if (check_result != '\0') {
        cpp_wrapper_get(tc,dict,key,value,'\0',1);
      }
      return;
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_update(
	planck_unit_test_t *tc,
	Dictionary<int, int>	*dict,
	int key,
	int value,
	ion_err_t expected_status,
	ion_result_count_t expected_count,
	ion_boolean_t check_result
) {
	ion_status_t status = dict->update(key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (check_result) {
		cpp_wrapper_get(tc, dict, key, value, err_ok, 1);
	}
}